

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

rel_iterator * __thiscall
dg::vr::ValueRelations::end_related
          (rel_iterator *__return_storage_ptr__,ValueRelations *this,V param_1)

{
  _Rb_tree_header *p_Var1;
  
  __return_storage_ptr__->vr = this;
  p_Var1 = &(__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->related)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->bucketIt)._M_node = (_Base_ptr)0x0;
  (__return_storage_ptr__->valueIt)._M_current = (Value **)0x0;
  (__return_storage_ptr__->current).first = (Value *)0x0;
  (__return_storage_ptr__->current).second.bits.super__Base_bitset<1UL>._M_w = 0;
  __return_storage_ptr__->isEnd = true;
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::rel_iterator ValueRelations::end_related(V /*val*/) const {
    return rel_iterator(*this);
}